

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O3

int64_t duckdb::DateSub::MillisecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                  (date_t startdate,date_t enddate)

{
  timestamp_t tVar1;
  timestamp_t tVar2;
  long lVar3;
  long left;
  
  tVar1.value = duckdb::Timestamp::FromDatetime(startdate,(dtime_t)0x0);
  tVar2.value = duckdb::Timestamp::FromDatetime(enddate,(dtime_t)0x0);
  lVar3 = duckdb::Timestamp::GetEpochMicroSeconds(tVar1);
  left = duckdb::Timestamp::GetEpochMicroSeconds(tVar2);
  lVar3 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,lVar3);
  return lVar3 / 1000;
}

Assistant:

int64_t DateSub::MillisecondsOperator::Operation(date_t startdate, date_t enddate) {
	dtime_t t0(0);
	return MillisecondsOperator::Operation<timestamp_t, timestamp_t, int64_t>(Timestamp::FromDatetime(startdate, t0),
	                                                                          Timestamp::FromDatetime(enddate, t0));
}